

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Access_ghost_element64(int g_a,void *ptr,int64_t *subscript,int64_t *ld)

{
  long in_RCX;
  long in_RDX;
  int in_EDI;
  int i_1;
  int i;
  Integer _ld [7];
  Integer _subscript [7];
  Integer ndim;
  Integer a;
  Integer *in_stack_00000128;
  Integer *in_stack_00000130;
  void *in_stack_00000138;
  Integer in_stack_00000140;
  int local_b0;
  int local_ac;
  long local_a8 [8];
  long local_68 [7];
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  
  local_28 = (long)in_EDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_30 = pnga_ndim(in_stack_00000140);
  for (local_ac = 0; local_ac < local_30; local_ac = local_ac + 1) {
    local_68[(local_30 - local_ac) + -1] = *(long *)(local_18 + (long)local_ac * 8) + 1;
  }
  for (local_b0 = 0; (long)local_b0 < local_30 + -1; local_b0 = local_b0 + 1) {
    local_a8[(local_30 - local_b0) + -2] = *(long *)(local_20 + (long)local_b0 * 8) + 1;
  }
  pnga_access_ghost_element_ptr
            (in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000128);
  return;
}

Assistant:

void NGA_Access_ghost_element64(int g_a, void *ptr, int64_t subscript[], int64_t ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer _subscript[MAXDIM];
     Integer _ld[MAXDIM];

     COPYINDEX_C2F(subscript, _subscript, ndim);
     COPYINDEX_C2F(ld, _ld, ndim-1);
     wnga_access_ghost_element_ptr(a, ptr, _subscript, _ld);
}